

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void boost::deflate::inflate_stream_test::testInflateErrors(IDecompressor *d)

{
  error_code eVar1;
  error_code expected;
  error_code expected_00;
  error_code expected_01;
  error_code expected_02;
  error_code expected_03;
  error_code expected_04;
  error_code expected_05;
  error_code expected_06;
  error_code expected_07;
  error_code expected_08;
  error_code expected_09;
  error_code expected_10;
  error_code expected_11;
  error_code expected_12;
  error_code expected_13;
  error_code expected_14;
  error_code expected_15;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffd9d;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffd9f;
  undefined1 uVar9;
  IDecompressor local_258;
  undefined7 uStack_250;
  undefined1 uStack_249;
  undefined7 uStack_248;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  uVar6 = 0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  uStack_250 = 5;
  uStack_249 = 0;
  eVar1 = make_error_code(invalid_stored_length);
  expected.cat_ = (error_category *)0x0;
  expected._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_38,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 3;
  uVar3 = 0;
  uStack_250 = 2;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(end_of_stream);
  expected_00.cat_ = (error_category *)0x0;
  expected_00._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_58,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_00,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 6;
  uStack_250 = 1;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_block_type);
  expected_01.cat_ = (error_category *)0x0;
  expected_01._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_78,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_01,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 0xfc;
  uVar3 = 0;
  uVar4 = 0;
  uStack_250 = 3;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(too_many_symbols);
  expected_02.cat_ = (error_category *)0x0;
  expected_02._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_98,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_02,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0;
  uVar4 = 0xfe;
  uVar5 = 0xff;
  uStack_250 = 4;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(incomplete_length_set);
  expected_03.cat_ = (error_category *)0x0;
  expected_03._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_b8,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_03,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0;
  uVar4 = 0x24;
  uVar5 = 0x49;
  uVar6 = 0;
  uStack_250 = 5;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_bit_length_repeat);
  expected_04.cat_ = (error_category *)0x0;
  expected_04._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_d8,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_04,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(in_stack_fffffffffffffd9d,
                                              CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(
                                                  uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0;
  uVar4 = 0x24;
  uVar5 = 0xe9;
  uVar6 = 0xff;
  uVar7 = 0xff;
  uStack_250 = 6;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_bit_length_repeat);
  expected_05.cat_ = (error_category *)0x0;
  expected_05._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_f8,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_05,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,
                                                  CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0;
  uVar4 = 0x24;
  uVar5 = 0xe9;
  uVar6 = 0xff;
  uVar7 = 0x6d;
  uStack_250 = 6;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(missing_eob);
  expected_06.cat_ = (error_category *)0x0;
  expected_06._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_118,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_06,0xf,
                   0xffffffffffffffff,
                   CONCAT17(in_stack_fffffffffffffd9f,
                            CONCAT16(in_stack_fffffffffffffd9e,
                                     CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,
                                                  CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0x80;
  uVar4 = 0x49;
  uVar5 = 0x92;
  uVar6 = 0x24;
  uVar7 = 0x49;
  uVar8 = 0x92;
  uVar9 = 0x24;
  uStack_250 = 0xe;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(over_subscribed_length);
  expected_07.cat_ = (error_category *)0x0;
  expected_07._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_138,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_07,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0x80;
  uVar4 = 0x49;
  uVar5 = 0x92;
  uVar6 = 0x24;
  uVar7 = 0xf;
  uVar8 = 0xb4;
  uVar9 = 0xff;
  uStack_250 = 0xb;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(incomplete_length_set);
  expected_08.cat_ = (error_category *)0x0;
  expected_08._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_158,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_08,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 4;
  uVar3 = 0xc0;
  uVar4 = 0x81;
  uVar5 = 8;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uStack_250 = 0xe;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_literal_length);
  expected_09.cat_ = (error_category *)0x0;
  expected_09._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_178,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_09,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 2;
  uVar3 = 0x7e;
  uVar4 = 0xff;
  uVar5 = 0xff;
  uStack_250 = 4;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_distance_code);
  expected_10.cat_ = (error_category *)0x0;
  expected_10._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_198,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_10,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 0xc;
  uVar3 = 0xc0;
  uVar4 = 0x81;
  uVar9 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uStack_250 = 0xd;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_distance);
  expected_11.cat_ = (error_category *)0x0;
  expected_11._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_1b8,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_11,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_258._vptr_IDecompressor = (_func_int **)0x2cb2cb249181e005;
  uStack_250 = 0x479a8b2e0fe249;
  uStack_249 = 0x56;
  uStack_248 = 0x1fffd2ecfefb9f;
  uVar2 = SUB81(&local_258,0);
  uVar3 = (undefined1)((ulong)&local_258 >> 8);
  uVar4 = (undefined1)((ulong)&local_258 >> 0x10);
  uVar5 = (undefined1)((ulong)&local_258 >> 0x18);
  uVar6 = (undefined1)((ulong)&local_258 >> 0x20);
  uVar7 = (undefined1)((ulong)&local_258 >> 0x28);
  uVar8 = (undefined1)((ulong)&local_258 >> 0x30);
  uVar9 = (undefined1)((ulong)&local_258 >> 0x38);
  eVar1 = make_error_code(end_of_stream);
  expected_12.cat_ = (error_category *)0x0;
  expected_12._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_1d8,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffd98,
                   eVar1._0_8_,expected_12,0xf,0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 0xed;
  uVar3 = 0xc0;
  uVar4 = 1;
  uVar5 = 1;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0x40;
  uStack_250 = 0xf;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(end_of_stream);
  expected_13.cat_ = (error_category *)0x0;
  expected_13._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_1f8,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_13,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 2;
  uVar3 = 8;
  uVar4 = 0x20;
  uVar5 = 0x80;
  uVar6 = 0;
  uVar7 = 3;
  uVar8 = 0;
  uStack_250 = 7;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(end_of_stream);
  expected_14.cat_ = (error_category *)0x0;
  expected_14._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_218,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_14,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  uVar2 = 0x78;
  uVar3 = 0x9c;
  uVar4 = 3;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 1;
  uStack_250 = 0xb;
  uStack_249 = 0;
  local_258._vptr_IDecompressor = (_func_int **)&stack0xfffffffffffffd98;
  eVar1 = make_error_code(invalid_stored_length);
  expected_15.cat_ = (error_category *)0x0;
  expected_15._0_8_ = eVar1.cat_;
  check_abi_cxx11_(&local_238,(inflate_stream_test *)d,&local_258,eVar1._0_8_,expected_15,0xf,
                   0xffffffffffffffff,
                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,CONCAT13(uVar5,
                                                  CONCAT12(uVar4,CONCAT11(uVar3,uVar2))))))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static
    void testInflateErrors(IDecompressor& d)
    {
        check(d, {0x00, 0x00, 0x00, 0x00, 0x00},
            error::invalid_stored_length);
        check(d, {0x03, 0x00},
            error::end_of_stream);
        check(d, {0x06},
            error::invalid_block_type);
        check(d, {0xfc, 0x00, 0x00},
            error::too_many_symbols);
        check(d, {0x04, 0x00, 0xfe, 0xff},
            error::incomplete_length_set);
        check(d, {0x04, 0x00, 0x24, 0x49, 0x00},
            error::invalid_bit_length_repeat);
        check(d, {0x04, 0x00, 0x24, 0xe9, 0xff, 0xff},
            error::invalid_bit_length_repeat);
        check(d, {0x04, 0x00, 0x24, 0xe9, 0xff, 0x6d},
            error::missing_eob);
        check(d, {0x04, 0x80, 0x49, 0x92, 0x24, 0x49, 0x92, 0x24,
               0x71, 0xff, 0xff, 0x93, 0x11, 0x00},
            error::over_subscribed_length);
        check(d, {0x04, 0x80, 0x49, 0x92, 0x24, 0x0f, 0xb4, 0xff,
               0xff, 0xc3, 0x84},
            error::incomplete_length_set);
        check(d, {0x04, 0xc0, 0x81, 0x08, 0x00, 0x00, 0x00, 0x00,
               0x20, 0x7f, 0xeb, 0x0b, 0x00, 0x00},
            error::invalid_literal_length);
        check(d, {0x02, 0x7e, 0xff, 0xff},
            error::invalid_distance_code);
        check(d, {0x0c, 0xc0, 0x81, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x90, 0xff, 0x6b, 0x04, 0x00},
            error::invalid_distance);
        check(d, {0x05,0xe0, 0x81, 0x91, 0x24, 0xcb, 0xb2, 0x2c,
               0x49, 0xe2, 0x0f, 0x2e, 0x8b, 0x9a, 0x47, 0x56,
               0x9f, 0xfb, 0xfe, 0xec, 0xd2, 0xff, 0x1f},
            error::end_of_stream);
        check(d, {0xed, 0xc0, 0x01, 0x01, 0x00, 0x00, 0x00, 0x40,
               0x20, 0xff, 0x57, 0x1b, 0x42, 0x2c, 0x4f},
            error::end_of_stream);
        check(d, {0x02, 0x08, 0x20, 0x80, 0x00, 0x03, 0x00},
            error::end_of_stream);
        check(d, {0x78, 0x9c, 0x03, 0x00, 0x00, 0x00, 0x00, 0x01, 0x78, 0x9c, 0xff},
            error::invalid_stored_length);
    }